

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::setRowHidden(QTreeView *this,int row,QModelIndex *parent,bool hide)

{
  QAbstractItemModel *pQVar1;
  byte bVar2;
  bool bVar3;
  QTreeViewPrivate *index_00;
  QSet<QPersistentModelIndex> *this_00;
  byte in_CL;
  QSet<QPersistentModelIndex> *in_RDX;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  QTreeViewPrivate *d;
  QModelIndex index;
  QModelIndex *in_stack_ffffffffffffff90;
  int delay;
  undefined7 in_stack_ffffffffffffffa0;
  QPersistentModelIndex local_40 [3];
  QPersistentModelIndex local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_CL & 1;
  index_00 = d_func((QTreeView *)0x8efc76);
  if ((index_00->super_QAbstractItemViewPrivate).model != (QAbstractItemModel *)0x0) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (index_00->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_20,pQVar1,in_ESI,0,in_RDX);
    bVar3 = QModelIndex::isValid(in_stack_ffffffffffffff90);
    if (bVar3) {
      if ((bVar2 & 1) == 0) {
        bVar3 = QAbstractItemViewPrivate::isPersistent
                          ((QAbstractItemViewPrivate *)CONCAT17(bVar2,in_stack_ffffffffffffffa0),
                           (QModelIndex *)index_00);
        if (bVar3) {
          this_00 = &index_00->hiddenIndexes;
          QPersistentModelIndex::QPersistentModelIndex(local_40,(QModelIndex *)&local_20);
          QSet<QPersistentModelIndex>::remove(this_00,(char *)local_40);
          QPersistentModelIndex::~QPersistentModelIndex(local_40);
        }
        delay = (int)((ulong)index_00 >> 0x20);
      }
      else {
        QPersistentModelIndex::QPersistentModelIndex(&local_28,(QModelIndex *)&local_20);
        delay = (int)((ulong)index_00 >> 0x20);
        QSet<QPersistentModelIndex>::insert
                  (in_RDX,(QPersistentModelIndex *)CONCAT17(bVar2,in_stack_ffffffffffffffa0));
        QPersistentModelIndex::~QPersistentModelIndex(&local_28);
      }
      QAbstractItemViewPrivate::doDelayedItemsLayout
                ((QAbstractItemViewPrivate *)CONCAT17(bVar2,in_stack_ffffffffffffffa0),delay);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::setRowHidden(int row, const QModelIndex &parent, bool hide)
{
    Q_D(QTreeView);
    if (!d->model)
        return;
    QModelIndex index = d->model->index(row, 0, parent);
    if (!index.isValid())
        return;

    if (hide) {
        d->hiddenIndexes.insert(index);
    } else if (d->isPersistent(index)) { //if the index is not persistent, it cannot be in the set
        d->hiddenIndexes.remove(index);
    }

    d->doDelayedItemsLayout();
}